

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * equality_expression(dmr_C *C,token *token,expression **tree)

{
  uint val;
  position pVar1;
  int iVar2;
  token *ptVar3;
  expression *peVar4;
  char *pcVar5;
  expression *local_48;
  expression *right;
  expression *local_38;
  expression *left;
  
  local_38 = (expression *)0x0;
  ptVar3 = relational_expression(C,token,&local_38);
  if (local_38 != (expression *)0x0) {
    right = local_38;
    do {
      if (((ulong)ptVar3->pos & 0x3f) != 0x11) goto LAB_001094d2;
      local_48 = (expression *)0x0;
      val = (ptVar3->field_2).argnum;
      iVar2 = 4;
      if ((val & 0xfffffffe) == 0x10a) {
        pVar1 = ptVar3->pos;
        peVar4 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)peVar4 = 0x16;
        peVar4->pos = pVar1;
        ptVar3 = relational_expression(C,ptVar3->next,&local_48);
        if (local_48 == (expression *)0x0) {
          pcVar5 = dmrC_show_special(C,val);
          dmrC_sparse_error(C,ptVar3->pos,"No right hand side of \'%s\'-expression",pcVar5);
          iVar2 = 3;
        }
        else {
          peVar4->field_0x1 =
               (byte)((ushort)*(undefined2 *)right >> 8) &
               (byte)((ushort)*(undefined2 *)local_48 >> 8) & 1;
          peVar4->op = val;
          (peVar4->field_5).field_3.unop = right;
          (peVar4->field_5).field_2.string = (string *)local_48;
          iVar2 = 0;
          right = peVar4;
          local_38 = peVar4;
        }
      }
    } while (iVar2 == 0);
    if (1 < iVar2 - 3U) {
      return ptVar3;
    }
  }
LAB_001094d2:
  *tree = local_38;
  return ptVar3;
}

Assistant:

static struct token *equality_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C, 
		token, tree, EXPR_COMPARE, relational_expression,
		(op == SPECIAL_EQUAL) || (op == SPECIAL_NOTEQUAL)
	);
}